

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O0

unzFile unzOpen2(char *path,zlib_filefunc_def *pzlib_filefunc32_def)

{
  undefined1 local_78 [8];
  zlib_filefunc64_32_def zlib_filefunc64_32_def_fill;
  zlib_filefunc_def *pzlib_filefunc32_def_local;
  char *path_local;
  
  zlib_filefunc64_32_def_fill.zseek32_file = (seek_file_func)pzlib_filefunc32_def;
  if (pzlib_filefunc32_def == (zlib_filefunc_def *)0x0) {
    path_local = (char *)unzOpenInternal(path,(zlib_filefunc64_32_def *)0x0,0);
  }
  else {
    fill_zlib_filefunc64_32_def_from_filefunc32
              ((zlib_filefunc64_32_def *)local_78,pzlib_filefunc32_def);
    path_local = (char *)unzOpenInternal(path,(zlib_filefunc64_32_def *)local_78,0);
  }
  return path_local;
}

Assistant:

extern unzFile ZEXPORT unzOpen2(const char* path,
    zlib_filefunc_def* pzlib_filefunc32_def)
{
    if (pzlib_filefunc32_def != NULL)
    {
        zlib_filefunc64_32_def zlib_filefunc64_32_def_fill;
        fill_zlib_filefunc64_32_def_from_filefunc32(&zlib_filefunc64_32_def_fill, pzlib_filefunc32_def);
        return unzOpenInternal(path, &zlib_filefunc64_32_def_fill, 0);
    }
    else
        return unzOpenInternal(path, NULL, 0);
}